

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O1

sexp sexp_define_foreign_param_aux
               (sexp ctx,sexp env,char *name,int num_args,char *fname,sexp_proc1 f,char *param)

{
  sexp psVar1;
  sexp psVar2;
  sexp tmp;
  sexp_gc_var_t __sexp_gc_preserver1;
  
  __sexp_gc_preserver1.var = &tmp;
  tmp = (sexp)&DAT_0000043e;
  __sexp_gc_preserver1.next = (ctx->value).context.saves;
  (ctx->value).context.saves = &__sexp_gc_preserver1;
  tmp = sexp_intern(ctx,param,-1);
  psVar1 = sexp_env_cell_loc(ctx,env,tmp,0,(sexp_conflict *)0x0);
  psVar2 = (sexp)&DAT_0000003e;
  tmp = (sexp)&DAT_0000003e;
  if (psVar1 != (sexp)0x0) {
    tmp = (psVar1->value).type.cpl;
  }
  if ((((ulong)tmp & 3) == 0) && (tmp->tag == 0x1b)) {
    psVar2 = sexp_define_foreign_aux(ctx,env,name,num_args,3,fname,f,tmp);
  }
  (ctx->value).context.saves = __sexp_gc_preserver1.next;
  return psVar2;
}

Assistant:

sexp sexp_define_foreign_param_aux (sexp ctx, sexp env, const char *name,
                                    int num_args, const char *fname, sexp_proc1 f, const char *param) {
  sexp res = SEXP_FALSE;
  sexp_gc_var1(tmp);
  sexp_gc_preserve1(ctx, tmp);
  tmp = sexp_intern(ctx, param, -1);
  tmp = sexp_env_ref(ctx, env, tmp, SEXP_FALSE);
  if (sexp_opcodep(tmp))
    res = sexp_define_foreign_aux(ctx, env, name, num_args, 3, fname, f, tmp);
  sexp_gc_release1(ctx);
  return res;
}